

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_quantize.c
# Opt level: O0

void invert_quant(int16_t *quant,int16_t *shift,int d)

{
  int iVar1;
  uint in_EDX;
  undefined2 *in_RSI;
  short *in_RDI;
  int m;
  int l;
  uint32_t t;
  
  iVar1 = get_msb(in_EDX);
  *in_RDI = (short)((1 << ((char)iVar1 + 0x10U & 0x1f)) / (int)in_EDX) + 1;
  *in_RSI = (short)(1 << (0x10U - (char)iVar1 & 0x1f));
  return;
}

Assistant:

static void invert_quant(int16_t *quant, int16_t *shift, int d) {
  uint32_t t;
  int l, m;
  t = d;
  l = get_msb(t);
  m = 1 + (1 << (16 + l)) / d;
  *quant = (int16_t)(m - (1 << 16));
  *shift = 1 << (16 - l);
}